

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::FrexpCase::getInputValues(FrexpCase *this,int numValues,void **values)

{
  float *pfVar1;
  deUint32 dVar2;
  DataType dataType;
  Precision precision_00;
  int iVar3;
  char *str;
  const_reference pvVar4;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *this_00;
  float fVar5;
  float maxValue;
  float *valuePtr;
  int scalarNdx;
  int caseNdx;
  int compNdx;
  int scalarSize;
  Precision precision;
  DataType type;
  Random rnd;
  Vec2 ranges [3];
  void **values_local;
  int numValues_local;
  FrexpCase *this_local;
  
  ranges[2].m_data = (float  [2])values;
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&rnd.m_rnd.z,-2.0,2.0);
  tcu::Vector<float,_2>::Vector(ranges,-1000.0,1000.0);
  tcu::Vector<float,_2>::Vector(ranges + 1,-1e+07,1e+07);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)&precision,dVar2 ^ 0x2790a);
  this_00 = &(this->super_CommonFunctionCase).m_spec.inputs;
  pvVar4 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  dataType = glu::VarType::getBasicType(&pvVar4->varType);
  pvVar4 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  precision_00 = glu::VarType::getPrecision(&pvVar4->varType);
  iVar3 = glu::getDataTypeScalarSize(dataType);
  for (scalarNdx = 0; scalarNdx < iVar3; scalarNdx = scalarNdx + 1) {
    *(undefined4 *)(*(long *)ranges[2].m_data + (long)scalarNdx * 4) = 0;
    *(undefined4 *)(*(long *)ranges[2].m_data + (long)(iVar3 + scalarNdx) * 4) = 0x80000000;
    *(undefined4 *)(*(long *)ranges[2].m_data + (long)(iVar3 * 2 + scalarNdx) * 4) = 0x3f000000;
    *(undefined4 *)(*(long *)ranges[2].m_data + (long)(iVar3 * 3 + scalarNdx) * 4) = 0xbf000000;
    *(undefined4 *)(*(long *)ranges[2].m_data + (long)(iVar3 * 4 + scalarNdx) * 4) = 0x3f800000;
    *(undefined4 *)(*(long *)ranges[2].m_data + (long)(iVar3 * 5 + scalarNdx) * 4) = 0xbf800000;
    *(undefined4 *)(*(long *)ranges[2].m_data + (long)(iVar3 * 6 + scalarNdx) * 4) = 0x40000000;
    *(undefined4 *)(*(long *)ranges[2].m_data + (long)(iVar3 * 7 + scalarNdx) * 4) = 0xc0000000;
  }
  fVar5 = tcu::Vector<float,_2>::x(ranges + ((ulong)precision_00 - 1));
  maxValue = tcu::Vector<float,_2>::y(ranges + ((ulong)precision_00 - 1));
  fillRandomScalars<float>
            ((Random *)&precision,fVar5,maxValue,
             (void *)(*(long *)ranges[2].m_data + (long)(iVar3 << 3) * 4),(numValues + -8) * iVar3,0
            );
  for (valuePtr._4_4_ = 0; valuePtr._4_4_ < numValues; valuePtr._4_4_ = valuePtr._4_4_ + 1) {
    for (valuePtr._0_4_ = 0; (int)valuePtr < iVar3; valuePtr._0_4_ = (int)valuePtr + 1) {
      pfVar1 = (float *)(*(long *)ranges[2].m_data +
                        (long)(valuePtr._4_4_ * iVar3 + (int)valuePtr) * 4);
      fVar5 = makeFloatRepresentable(*pfVar1,precision_00);
      *pfVar1 = fVar5;
    }
  }
  de::Random::~Random((Random *)&precision);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd			(deStringHash(getName()) ^ 0x2790au);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		// Special cases
		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			((float*)values[0])[scalarSize*0 + compNdx] = 0.0f;
			((float*)values[0])[scalarSize*1 + compNdx] = -0.0f;
			((float*)values[0])[scalarSize*2 + compNdx] = 0.5f;
			((float*)values[0])[scalarSize*3 + compNdx] = -0.5f;
			((float*)values[0])[scalarSize*4 + compNdx] = 1.0f;
			((float*)values[0])[scalarSize*5 + compNdx] = -1.0f;
			((float*)values[0])[scalarSize*6 + compNdx] = 2.0f;
			((float*)values[0])[scalarSize*7 + compNdx] = -2.0f;
		}

		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[0] + 8*scalarSize, (numValues-8)*scalarSize);

		// Make sure the values are representable in the target format
		for (int caseNdx = 0; caseNdx < numValues; ++caseNdx)
		{
			for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
			{
				float* const valuePtr = &((float*)values[0])[caseNdx * scalarSize + scalarNdx];

				*valuePtr = makeFloatRepresentable(*valuePtr, precision);
			}
		}
	}